

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ReceivedServerConnect(Curl_easy *data,_Bool *received)

{
  dynbuf *s;
  curl_socket_t readfd0;
  curl_socket_t readfd1;
  connectdata *pcVar1;
  curl_trc_feat *pcVar2;
  int iVar3;
  uint uVar4;
  timediff_t tVar5;
  size_t sVar6;
  char *pcVar7;
  long slnum;
  int ftpcode;
  ssize_t nread;
  uint local_3c;
  ssize_t local_38;
  
  pcVar1 = data->conn;
  readfd0 = pcVar1->sock[0];
  readfd1 = pcVar1->sock[1];
  *received = false;
  tVar5 = ftp_timeleft_accept(data);
  if ((((data->set).field_0x8cd & 0x10) != 0) &&
     ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
    Curl_infof(data,"Checking for server connect");
  }
  if (tVar5 < 0) {
    Curl_failf(data,"Accept timeout occurred while waiting server connect");
    return CURLE_FTP_ACCEPT_TIMEOUT;
  }
  s = &(pcVar1->proto).ftpc.pp.recvbuf;
  sVar6 = Curl_dyn_len(s);
  if ((sVar6 != 0) && (pcVar7 = Curl_dyn_ptr(s), '3' < *pcVar7)) {
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
      Curl_infof(data,"There is negative response in cache while serv connect");
    }
    Curl_GetFTPResponse(data,&local_38,(int *)&local_3c);
    return CURLE_FTP_ACCEPT_FAILED;
  }
  if ((pcVar1->proto).ftpc.pp.overflow == 0) {
    uVar4 = Curl_socket_check(readfd0,readfd1,-1,0);
    if (uVar4 == 0) {
      return CURLE_OK;
    }
    if (uVar4 == 0xffffffff) {
      Curl_failf(data,"Error while waiting for server connect");
      return CURLE_FTP_ACCEPT_FAILED;
    }
    if ((uVar4 & 8) == 0) {
      if ((uVar4 & 1) == 0) {
        return CURLE_OK;
      }
      goto LAB_0012c5de;
    }
    if ((((data->set).field_0x8cd & 0x10) == 0) ||
       ((pcVar2 = (data->state).feat, pcVar2 != (curl_trc_feat *)0x0 && (pcVar2->log_level < 1))))
    goto LAB_0012c793;
    pcVar7 = "Ready to accept data connection from server";
  }
  else {
LAB_0012c5de:
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
      Curl_infof(data,"Ctrl conn has data while waiting for data conn");
    }
    if ((pcVar1->proto).ftpc.pp.overflow < 4) {
LAB_0012c6bd:
      Curl_GetFTPResponse(data,&local_38,(int *)&local_3c);
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
      {
        Curl_infof(data,"FTP code: %03d",(ulong)local_3c);
      }
      return (uint)(399 < (int)local_3c) * 2 + CURLE_WEIRD_SERVER_REPLY;
    }
    pcVar7 = Curl_dyn_ptr(s);
    sVar6 = (pcVar1->proto).ftpc.pp.nfinal;
    if ((((9 < (byte)(pcVar7[sVar6] - 0x30U)) ||
         (pcVar7 = pcVar7 + sVar6, 9 < (byte)(pcVar7[1] - 0x30U))) ||
        (9 < (byte)(pcVar7[2] - 0x30U))) || (pcVar7[3] != ' ')) goto LAB_0012c6bd;
    slnum = strtol(pcVar7,(char **)0x0,10);
    iVar3 = curlx_sltosi(slnum);
    if (iVar3 != 0xe2) goto LAB_0012c6bd;
    if ((((data->set).field_0x8cd & 0x10) == 0) ||
       ((pcVar2 = (data->state).feat, pcVar2 != (curl_trc_feat *)0x0 && (pcVar2->log_level < 1))))
    goto LAB_0012c793;
    pcVar7 = "Got 226 before data activity";
  }
  Curl_infof(data,pcVar7);
LAB_0012c793:
  *received = true;
  return CURLE_OK;
}

Assistant:

static CURLcode ReceivedServerConnect(struct Curl_easy *data, bool *received)
{
  struct connectdata *conn = data->conn;
  curl_socket_t ctrl_sock = conn->sock[FIRSTSOCKET];
  curl_socket_t data_sock = conn->sock[SECONDARYSOCKET];
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  int socketstate = 0;
  timediff_t timeout_ms;
  ssize_t nread;
  int ftpcode;
  bool response = FALSE;

  *received = FALSE;

  timeout_ms = ftp_timeleft_accept(data);
  infof(data, "Checking for server connect");
  if(timeout_ms < 0) {
    /* if a timeout was already reached, bail out */
    failf(data, "Accept timeout occurred while waiting server connect");
    return CURLE_FTP_ACCEPT_TIMEOUT;
  }

  /* First check whether there is a cached response from server */
  if(Curl_dyn_len(&pp->recvbuf) && (*Curl_dyn_ptr(&pp->recvbuf) > '3')) {
    /* Data connection could not be established, let's return */
    infof(data, "There is negative response in cache while serv connect");
    (void)Curl_GetFTPResponse(data, &nread, &ftpcode);
    return CURLE_FTP_ACCEPT_FAILED;
  }

  if(pp->overflow)
    /* there is pending control data still in the buffer to read */
    response = TRUE;
  else
    socketstate = Curl_socket_check(ctrl_sock, data_sock, CURL_SOCKET_BAD, 0);

  /* see if the connection request is already here */
  switch(socketstate) {
  case -1: /* error */
    /* let's die here */
    failf(data, "Error while waiting for server connect");
    return CURLE_FTP_ACCEPT_FAILED;
  case 0:  /* Server connect is not received yet */
    break; /* loop */
  default:
    if(socketstate & CURL_CSELECT_IN2) {
      infof(data, "Ready to accept data connection from server");
      *received = TRUE;
    }
    else if(socketstate & CURL_CSELECT_IN)
      response = TRUE;
    break;
  }
  if(response) {
    infof(data, "Ctrl conn has data while waiting for data conn");
    if(pp->overflow > 3) {
      char *r = Curl_dyn_ptr(&pp->recvbuf);

      DEBUGASSERT((pp->overflow + pp->nfinal) <=
                  Curl_dyn_len(&pp->recvbuf));
      /* move over the most recently handled response line */
      r += pp->nfinal;

      if(LASTLINE(r)) {
        int status = curlx_sltosi(strtol(r, NULL, 10));
        if(status == 226) {
          /* funny timing situation where we get the final message on the
             control connection before traffic on the data connection has been
             noticed. Leave the 226 in there and use this as a trigger to read
             the data socket. */
          infof(data, "Got 226 before data activity");
          *received = TRUE;
          return CURLE_OK;
        }
      }
    }

    (void)Curl_GetFTPResponse(data, &nread, &ftpcode);

    infof(data, "FTP code: %03d", ftpcode);

    if(ftpcode/100 > 3)
      return CURLE_FTP_ACCEPT_FAILED;

    return CURLE_WEIRD_SERVER_REPLY;
  }

  return CURLE_OK;
}